

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O1

void deqp::gles2::Functional::anon_unknown_0::logVertexFragmentProgram
               (TestLog *log,RenderContext *renderCtx,Program *program,Shader *vertShader,
               Shader *fragShader)

{
  bool linkOk;
  pointer pcVar1;
  long *local_48 [2];
  long local_38 [2];
  
  linkOk = (program->m_info).linkOk;
  pcVar1 = (program->m_info).infoLog._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + (program->m_info).infoLog._M_string_length);
  tcu::TestLog::startShaderProgram(log,linkOk,(char *)local_48[0]);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  logShader(log,renderCtx,vertShader);
  logShader(log,renderCtx,fragShader);
  tcu::TestLog::endShaderProgram(log);
  return;
}

Assistant:

void logVertexFragmentProgram (TestLog& log, glu::RenderContext& renderCtx, glu::Program& program, glu::Shader& vertShader, glu::Shader& fragShader)
{
	DE_ASSERT(vertShader.getType() == glu::SHADERTYPE_VERTEX && fragShader.getType() == glu::SHADERTYPE_FRAGMENT);

	log << TestLog::ShaderProgram(program.getLinkStatus(), program.getInfoLog());

	logShader(log, renderCtx, vertShader);
	logShader(log, renderCtx, fragShader);

	log << TestLog::EndShaderProgram;
}